

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::StripProto_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view filename)

{
  string_view str;
  string_view str_00;
  string_view text;
  bool bVar1;
  allocator<char> local_c9;
  string_view local_c8;
  compiler *local_b8;
  char *pcStack_b0;
  string_view local_a0 [2];
  allocator<char> local_79;
  string_view local_78;
  compiler *local_68;
  char *pcStack_60;
  string_view local_50;
  string_view local_40;
  compiler *local_30;
  char *local_28;
  compiler *pcStack_20;
  string_view filename_local;
  
  local_28 = (char *)filename._M_len;
  local_30 = this;
  pcStack_20 = this;
  filename_local._M_len = (size_t)local_28;
  filename_local._M_str = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,".protodevel");
  text._M_str = local_28;
  text._M_len = (size_t)local_30;
  bVar1 = absl::lts_20240722::EndsWith(text,local_40);
  if (bVar1) {
    local_68 = pcStack_20;
    pcStack_60 = (char *)filename_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,".protodevel");
    str_00._M_str = pcStack_60;
    str_00._M_len = (size_t)local_68;
    local_50 = absl::lts_20240722::StripSuffix(str_00,local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_50,&local_79);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    local_b8 = pcStack_20;
    pcStack_b0 = (char *)filename_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,".proto");
    str._M_str = pcStack_b0;
    str._M_len = (size_t)local_b8;
    local_a0[0] = absl::lts_20240722::StripSuffix(str,local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,local_a0,&local_c9);
    std::allocator<char>::~allocator(&local_c9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(absl::string_view filename) {
  if (absl::EndsWith(filename, ".protodevel")) {
    return std::string(absl::StripSuffix(filename, ".protodevel"));
  } else {
    return std::string(absl::StripSuffix(filename, ".proto"));
  }
}